

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

void JitFFI::OpCode_x64::_mov_offset_header<(unsigned_char)64>
               (JitFuncCreater *jfc,Register dst,Register src)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = (byte)src;
  bVar2 = (byte)dst;
  if ((src & ~r15) == prax && dst < prax) {
    JitFuncCreater::push(jfc,bVar2 >> 1 & 4 | bVar1 >> 3 | 0x48,0x8b,bVar1 & 0x47);
    if ((src == prbp) || (src == pr12)) {
LAB_00112871:
      JitFuncCreater::push(jfc,'$');
      return;
    }
  }
  else {
    if (((dst & ~r15) != prax) || (r15b < src)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                    ,0x197,
                    "void JitFFI::OpCode_x64::_mov_offset_header(JitFuncCreater &, Register, Register) [V = (unsigned char)\'@\']"
                   );
    }
    JitFuncCreater::push(jfc,bVar1 >> 1 & 4 | bVar2 >> 3 | 0x48,0x89,bVar2 & 0x47);
    if ((dst == prbp) || (dst == pr12)) goto LAB_00112871;
  }
  return;
}

Assistant:

inline void _mov_offset_header(JitFuncCreater &jfc, Register dst, Register src) {
			if (is_rx(dst) && is_prx(src)) {
				jfc.push(_get_mov_head_rpxq(src, dst), 0x8b, V + get_code(src));
				if (src == prbp || src == pr12)
					jfc.push(0x24);
			}
			else if (is_prx(dst) && is_rx(src)) {
				jfc.push(_get_mov_head_rpxq(dst, src), 0x89, V + get_code(dst));
				if (dst == prbp || dst == pr12)
					jfc.push(0x24);
			}
			else
				assert(false);
		}